

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError file2string(char **bufp,FILE *file)

{
  CURLcode CVar1;
  char *pcVar2;
  char *ptr;
  char buffer [256];
  undefined1 local_40 [8];
  dynbuf dyn;
  FILE *file_local;
  char **bufp_local;
  
  dyn.toobig = (size_t)file;
  curlx_dyn_init((dynbuf *)local_40,0x10000000);
  if (dyn.toobig == 0) {
LAB_00120a26:
    pcVar2 = curlx_dyn_ptr((dynbuf *)local_40);
    *bufp = pcVar2;
    bufp_local._4_4_ = PARAM_OK;
  }
  else {
    do {
      pcVar2 = fgets((char *)&ptr,0x100,(FILE *)dyn.toobig);
      if (pcVar2 == (char *)0x0) goto LAB_00120a26;
      pcVar2 = strchr((char *)&ptr,0xd);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      pcVar2 = strchr((char *)&ptr,10);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      CVar1 = curlx_dyn_add((dynbuf *)local_40,(char *)&ptr);
    } while (CVar1 == CURLE_OK);
    bufp_local._4_4_ = PARAM_NO_MEM;
  }
  return bufp_local._4_4_;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  struct curlx_dynbuf dyn;
  curlx_dyn_init(&dyn, MAX_FILE2STRING);
  if(file) {
    char buffer[256];

    while(fgets(buffer, sizeof(buffer), file)) {
      char *ptr = strchr(buffer, '\r');
      if(ptr)
        *ptr = '\0';
      ptr = strchr(buffer, '\n');
      if(ptr)
        *ptr = '\0';
      if(curlx_dyn_add(&dyn, buffer))
        return PARAM_NO_MEM;
    }
  }
  *bufp = curlx_dyn_ptr(&dyn);
  return PARAM_OK;
}